

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O0

int __thiscall ModuleWriter::verifyAndWriteModule(ModuleWriter *this)

{
  bool bVar1;
  ModuleWriter *in_RDI;
  raw_ostream *unaff_retaddr;
  ModuleWriter *in_stack_00000280;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  bVar1 = verifyModule(in_RDI);
  if (bVar1) {
    bVar1 = writeModule(in_stack_00000280);
    if (bVar1) {
      iVar2 = 0;
    }
    else {
      llvm::errs();
      llvm::raw_ostream::operator<<
                (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                );
      iVar2 = 1;
    }
  }
  else {
    llvm::errs();
    llvm::raw_ostream::operator<<
              (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    llvm::errs();
    llvm::raw_ostream::operator<<
              (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int verifyAndWriteModule() {
        if (!verifyModule()) {
            llvm::errs() << "[llvm-slicer] ERROR: Verifying module failed, the "
                            "IR is not valid\n";
            llvm::errs()
                    << "[llvm-slicer] Saving anyway so that you can check it\n";
            return 1;
        }

        if (!writeModule()) {
            llvm::errs() << "Saving sliced module failed\n";
            return 1;
        }

        // exit code
        return 0;
    }